

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ilimit_w;
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  int *mEnd;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  int *ip;
  seqDef *psVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  uint uVar15;
  uint local_ac;
  uint local_a8;
  int local_80;
  size_t offbaseFound;
  BYTE *local_70;
  int *local_68;
  uint local_5c;
  BYTE *local_58;
  BYTE *local_50;
  int *local_48;
  BYTE *local_40;
  uint *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  uVar15 = (ms->cParams).minMatch;
  uVar6 = 6;
  if (uVar15 < 6) {
    uVar6 = uVar15;
  }
  uVar15 = 4;
  if (4 < uVar6) {
    uVar15 = uVar6;
  }
  local_70 = pBVar3 + uVar2;
  local_a8 = *rep;
  pZVar4 = ms->dictMatchState;
  local_68 = (int *)(pZVar4->window).nextSrc;
  local_50 = (pZVar4->window).base;
  local_40 = local_50 + (pZVar4->window).dictLimit;
  uVar6 = ((int)src - ((int)local_70 + (int)local_40)) + (int)local_68;
  ip = (int *)((long)src + (ulong)(uVar6 == 0));
  if (uVar6 < local_a8) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_ac = rep[1];
  if (uVar6 < local_ac) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_48 = (int *)((long)src + (srcSize - 8));
  local_5c = ((int)local_50 - (int)local_68) + uVar2;
  ms->lazySkipping = 0;
  local_58 = local_50 + -(ulong)local_5c;
  ilimit_w = iEnd + -8;
  local_38 = rep;
LAB_001c2073:
  do {
    if (local_48 <= ip) {
      *rep = local_a8;
      rep[1] = local_ac;
      return (long)iEnd - (long)src;
    }
    local_80 = (int)pBVar3;
    uVar6 = (((int)ip - local_80) - local_a8) + 1;
    if (uVar6 - uVar2 < 0xfffffffd) {
      piVar9 = (int *)(pBVar3 + uVar6);
      if (uVar6 < uVar2) {
        piVar9 = (int *)(local_50 + (uVar6 - local_5c));
      }
      if (*piVar9 != *(int *)((long)ip + 1)) goto LAB_001c20bb;
      mEnd = iEnd;
      if (uVar6 < uVar2) {
        mEnd = local_68;
      }
      sVar8 = ZSTD_count_2segments
                        ((BYTE *)((long)ip + 5),(BYTE *)(piVar9 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                         local_70);
      uVar7 = sVar8 + 4;
      ip = (int *)((long)ip + 1);
      sVar8 = 1;
    }
    else {
LAB_001c20bb:
      offbaseFound = 999999999;
      if (uVar15 == 6) {
        uVar7 = ZSTD_HcFindBestMatch_dictMatchState_6(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else if (uVar15 == 5) {
        uVar7 = ZSTD_HcFindBestMatch_dictMatchState_5(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else {
        uVar7 = ZSTD_HcFindBestMatch_dictMatchState_4(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      if (uVar7 < 4) {
        uVar7 = (long)ip - (long)src;
        ip = (int *)((long)ip + (uVar7 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar7);
        goto LAB_001c2073;
      }
      sVar8 = offbaseFound;
      if (3 < offbaseFound) {
        uVar10 = (long)ip + (-(long)pBVar3 - offbaseFound) + -0xfffffffd;
        pBVar13 = pBVar3;
        pBVar14 = local_70;
        if ((uint)uVar10 < uVar2) {
          pBVar13 = local_58;
          pBVar14 = local_40;
        }
        pBVar13 = pBVar13 + (uVar10 & 0xffffffff);
        for (; ((src < ip && (pBVar14 < pBVar13)) && (*(BYTE *)((long)ip + -1) == pBVar13[-1]));
            ip = (int *)((long)ip + -1)) {
          pBVar13 = pBVar13 + -1;
          uVar7 = uVar7 + 1;
        }
        local_ac = local_a8;
        local_a8 = (int)offbaseFound - 3;
      }
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001c24fa:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_001c2557:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar10 = (long)ip - (long)src;
    pBVar14 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar14 + uVar10) {
LAB_001c2519:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < ip) {
LAB_001c2538:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (ilimit_w < ip) {
      ZSTD_safecopyLiterals(pBVar14,(BYTE *)src,(BYTE *)ip,(BYTE *)ilimit_w);
LAB_001c2270:
      seqStore->lit = seqStore->lit + uVar10;
      if (0xffff < uVar10) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar5 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar14 = *src;
      *(undefined8 *)(pBVar14 + 8) = uVar5;
      pBVar14 = seqStore->lit;
      if (0x10 < uVar10) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar14 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar5 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar14 + 0x18) = uVar5;
        if (0x20 < (long)uVar10) {
          lVar11 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar11 + 0x20);
            uVar5 = puVar1[1];
            pBVar13 = pBVar14 + lVar11 + 0x20;
            *(undefined8 *)pBVar13 = *puVar1;
            *(undefined8 *)(pBVar13 + 8) = uVar5;
            puVar1 = (undefined8 *)((long)src + lVar11 + 0x30);
            uVar5 = puVar1[1];
            *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar13 + 0x18) = uVar5;
            lVar11 = lVar11 + 0x20;
          } while (pBVar13 + 0x20 < pBVar14 + uVar10);
        }
        goto LAB_001c2270;
      }
      seqStore->lit = pBVar14 + uVar10;
    }
    rep = local_38;
    psVar12 = seqStore->sequences;
    psVar12->litLength = (U16)uVar10;
    psVar12->offBase = (U32)sVar8;
    if (uVar7 < 3) {
LAB_001c2576:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar7 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001c2595:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar12->mlBase = (U16)(uVar7 - 3);
    psVar12 = psVar12 + 1;
    seqStore->sequences = psVar12;
    if (ms->lazySkipping != 0) {
      ms->lazySkipping = 0;
    }
    uVar6 = local_ac;
    for (ip = (int *)((long)ip + uVar7); local_ac = uVar6, src = ip, ip <= local_48;
        ip = (int *)((long)ip + sVar8 + 4)) {
      uVar6 = ((int)ip - local_80) - local_ac;
      pBVar14 = pBVar3;
      if (uVar6 < uVar2) {
        pBVar14 = local_58;
      }
      if ((0xfffffffc < uVar6 - uVar2) || (*(int *)(pBVar14 + uVar6) != *ip)) break;
      piVar9 = iEnd;
      if (uVar6 < uVar2) {
        piVar9 = local_68;
      }
      sVar8 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar14 + uVar6) + 4),(BYTE *)iEnd,
                         (BYTE *)piVar9,local_70);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar12 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001c24fa;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001c2557;
      pBVar14 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar14) goto LAB_001c2519;
      if (iEnd < ip) goto LAB_001c2538;
      if (ilimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar14,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
      }
      else {
        uVar5 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar14 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar14 + 8) = uVar5;
      }
      psVar12 = seqStore->sequences;
      psVar12->litLength = 0;
      psVar12->offBase = 1;
      if (sVar8 + 4 < 3) goto LAB_001c2576;
      if (0xffff < sVar8 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c2595;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar12->mlBase = (U16)(sVar8 + 1);
      psVar12 = psVar12 + 1;
      seqStore->sequences = psVar12;
      uVar6 = local_a8;
      local_a8 = local_ac;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dictMatchState);
}